

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

vector4 * vector4_normalize(vector4 *self)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  
  auVar4 = *(undefined1 (*) [16])&self->field_0;
  auVar1 = *(undefined1 (*) [16])((long)&self->field_0 + 0x10);
  dVar3 = SQRT(auVar1._8_8_ * auVar1._8_8_ +
               auVar1._0_8_ * auVar1._0_8_ +
               auVar4._0_8_ * auVar4._0_8_ + auVar4._8_8_ * auVar4._8_8_);
  if (1e-05 <= dVar3) {
    uVar5 = (undefined4)((ulong)dVar3 >> 0x20);
    auVar2._8_4_ = SUB84(dVar3,0);
    auVar2._0_8_ = dVar3;
    auVar2._12_4_ = uVar5;
    auVar4 = divpd(auVar4,auVar2);
    *(undefined1 (*) [16])&self->field_0 = auVar4;
    auVar4._8_4_ = SUB84(dVar3,0);
    auVar4._0_8_ = dVar3;
    auVar4._12_4_ = uVar5;
    auVar4 = divpd(auVar1,auVar4);
    *(undefined1 (*) [16])((long)&self->field_0 + 0x10) = auVar4;
  }
  return self;
}

Assistant:

HYPAPI struct vector4 *vector4_normalize(struct vector4 *self)
{
	HYP_FLOAT mag;

	mag = vector4_magnitude(self);

	if (scalar_equalsf(mag, 0.0)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x = self->x / mag;
	self->y = self->y / mag;
	self->z = self->z / mag;
	self->w = self->w / mag;

	return self;
}